

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

double trng::math::Phi(double x)

{
  double dVar1;
  
  dVar1 = x * 0.7071067811865476;
  if (-0.4769362762044699 <= dVar1) {
    if (dVar1 <= 0.4769362762044699) {
      dVar1 = erf(dVar1);
      dVar1 = dVar1 * 0.5 + 0.5;
    }
    else {
      dVar1 = erfc(dVar1);
      dVar1 = dVar1 * -0.5 + 1.0;
    }
  }
  else {
    dVar1 = erfc(-dVar1);
    dVar1 = dVar1 * 0.5;
  }
  return dVar1;
}

Assistant:

TRNG_CUDA_ENABLE
    inline double Phi(double x) {
      x *= constants<double>::one_over_sqrt_2;
      if (x < -0.6744897501960817 * constants<double>::one_over_sqrt_2)
        return 0.5 * erfc(-x);
      if (x > +0.6744897501960817 * constants<double>::one_over_sqrt_2)
        return 1.0 - 0.5 * erfc(x);
      return 0.5 + 0.5 * erf(x);
    }